

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_collection.cpp
# Opt level: O0

void __thiscall
duckdb::WindowCursor::WindowCursor
          (WindowCursor *this,WindowCollection *paged,vector<unsigned_long,_true> *column_ids)

{
  bool bVar1;
  idx_t iVar2;
  ColumnDataScanState *in_RDX;
  WindowCollection *in_RSI;
  undefined8 *in_RDI;
  ColumnDataCollectionPtr *inputs;
  undefined7 in_stack_ffffffffffffff68;
  ColumnDataScanProperties in_stack_ffffffffffffff6f;
  ColumnDataScanState *in_stack_ffffffffffffff70;
  ColumnDataScanState *state;
  vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> *in_stack_ffffffffffffff80;
  ColumnDataCollection *this_00;
  DataChunk *in_stack_ffffffffffffffe0;
  
  *in_RDI = in_RSI;
  ColumnDataScanState::ColumnDataScanState(in_stack_ffffffffffffff70);
  DataChunk::DataChunk((DataChunk *)in_stack_ffffffffffffff70);
  bVar1 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_ffffffffffffff80);
  if (bVar1) {
    in_RDI[9] = 0;
    in_RDI[10] = 0;
    in_RDI[0xb] = 0;
    iVar2 = WindowCollection::size(in_RSI);
    in_RDI[0xc] = iVar2;
    *(undefined1 *)(in_RDI + 0xd) = 1;
    DataChunk::SetCapacity((DataChunk *)(in_RDI + 0x11),in_RDI[0xc]);
    DataChunk::SetCardinality((DataChunk *)(in_RDI + 0x11),in_RDI[0xc]);
  }
  else {
    bVar1 = ::std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::empty
                      (in_stack_ffffffffffffff80);
    if (bVar1) {
      unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
      ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                    *)in_stack_ffffffffffffff70);
      state = (ColumnDataScanState *)(in_RDI + 1);
      this_00 = (ColumnDataCollection *)&stack0xffffffffffffffb8;
      vector<unsigned_long,_true>::vector
                ((vector<unsigned_long,_true> *)in_stack_ffffffffffffff70,
                 (vector<unsigned_long,_true> *)
                 CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      ColumnDataCollection::InitializeScan
                (this_00,state,(vector<unsigned_long,_true> *)in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff6f);
      vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x1a366f1);
      unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
      ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                    *)in_stack_ffffffffffffff70);
      ColumnDataCollection::InitializeScanChunk
                ((ColumnDataCollection *)in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    }
  }
  return;
}

Assistant:

WindowCursor::WindowCursor(const WindowCollection &paged, vector<column_t> column_ids) : paged(paged) {
	D_ASSERT(paged.collections.empty());
	D_ASSERT(paged.ranges.empty());
	if (column_ids.empty()) {
		//	For things like COUNT(*) set the state up to contain the whole range
		state.segment_index = 0;
		state.chunk_index = 0;
		state.current_row_index = 0;
		state.next_row_index = paged.size();
		state.properties = ColumnDataScanProperties::ALLOW_ZERO_COPY;
		chunk.SetCapacity(state.next_row_index);
		chunk.SetCardinality(state.next_row_index);
		return;
	} else if (chunk.data.empty()) {
		auto &inputs = paged.inputs;
		D_ASSERT(inputs.get());
		inputs->InitializeScan(state, std::move(column_ids));
		inputs->InitializeScanChunk(state, chunk);
	}
}